

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O1

_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
 __thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
_shift_le<std::_Rb_tree_const_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
          (DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset> *this,
          _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
          *startge,IntervalT *I)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
  _Var4;
  
  p_Var1 = (_Rb_tree_node_base *)(this + 8);
  p_Var2 = startge->_M_node;
  if (p_Var2 == p_Var1) {
    _Var4._M_node = (_Base_ptr)std::_Rb_tree_decrement(p_Var1);
    if (_Var4._M_node[1]._M_parent < (_Base_ptr)(I->start).offset) {
      _Var4._M_node = p_Var1;
    }
  }
  else {
    if ((p_Var2 != *(_Rb_tree_node_base **)(this + 0x18)) &&
       (p_Var3 = (_Base_ptr)std::_Rb_tree_decrement(startge->_M_node),
       (_Base_ptr)(I->start).offset <= p_Var3[1]._M_parent)) {
      return (_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
              )p_Var3;
    }
    _Var4._M_node = p_Var1;
    if (*(ulong *)(p_Var2 + 1) <= (I->end).offset) {
      _Var4._M_node = startge->_M_node;
    }
  }
  return (_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
          )_Var4._M_node;
}

Assistant:

IteratorT _shift_le(const IteratorT &startge, const IntervalT &I) const {
        // find the element that starts at the same value
        // as I or later (i.e. I.start >= it.start)
        if (startge == end()) {
            auto last = _get_last();
            if (last->first.end >= I.start) {
                assert(last->first.overlaps(I));
                return last;
            }

            return end();
        }

        assert(startge->first.start >= I.start);

        // check whether there's
        // an previous interval with an overlap
        if (startge != begin()) {
            auto tmp = startge;
            --tmp;
            if (tmp->first.end >= I.start) {
                assert(tmp->first.overlaps(I));
                return tmp;
            }
            // fall-through
        }

        // starge is the first interval or the
        // previous interval does not overlap.
        // Just check whether this interval overlaps
        if (startge->first.start > I.end)
            return end();

        assert(startge->first.overlaps(I));
        return startge;
    }